

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFHelper.h
# Opt level: O3

void __thiscall Assimp::DXF::LineReader::LineReader(LineReader *this,StreamReaderLE *reader)

{
  (this->splitter).mIdx = 0;
  (this->splitter).mCur._M_dataplus._M_p = (pointer)&(this->splitter).mCur.field_2;
  (this->splitter).mCur._M_string_length = 0;
  (this->splitter).mCur.field_2._M_local_buf[0] = '\0';
  (this->splitter).mStream = reader;
  (this->splitter).mSwallow = false;
  (this->splitter).mSkip_empty_lines = false;
  (this->splitter).mTrim = true;
  std::__cxx11::string::reserve((ulong)&(this->splitter).mCur);
  LineSplitter::operator++(&this->splitter);
  (this->splitter).mIdx = 0;
  this->groupcode = 0;
  (this->value)._M_dataplus._M_p = (pointer)&(this->value).field_2;
  (this->value)._M_string_length = 0;
  (this->value).field_2._M_local_buf[0] = '\0';
  this->end = 0;
  return;
}

Assistant:

LineReader(StreamReaderLE& reader)
    : splitter(reader,false,true)
    , groupcode( 0 )
    , value()
    , end() {
        // empty
    }